

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextEditState::OnKeyPressed(ImGuiTextEditState *this,int key)

{
  STB_TexteditState *state;
  float *pfVar1;
  int *piVar2;
  ImWchar *pIVar3;
  float fVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  unsigned_short *puVar10;
  StbUndoRecord *pSVar11;
  bool bVar12;
  short sVar13;
  int temp;
  int iVar14;
  int iVar15;
  ImGuiStb *pIVar16;
  long lVar17;
  int temp_1;
  int iVar18;
  long lVar19;
  short *psVar20;
  ulong uVar21;
  undefined8 in_R8;
  uint uVar22;
  float fVar23;
  float fVar24;
  StbFindState find;
  uchar local_74;
  ImWchar *local_50;
  ImWchar local_48 [6];
  int local_3c;
  int local_38;
  int local_34;
  
  state = &this->StbState;
  pfVar1 = &(this->StbState).preferred_x;
  do {
    switch(key) {
    case 0x10000:
      iVar15 = (this->StbState).select_start;
      iVar18 = (this->StbState).select_end;
      if (iVar15 == iVar18) {
        if (0 < state->cursor) {
          state->cursor = state->cursor + -1;
        }
      }
      else {
        if (iVar18 < iVar15) {
          (this->StbState).select_end = iVar15;
          (this->StbState).select_start = iVar18;
        }
        iVar15 = (this->StbState).select_start;
        (this->StbState).cursor = iVar15;
        (this->StbState).select_end = iVar15;
        (this->StbState).has_preferred_x = '\0';
      }
      goto LAB_001957b4;
    case 0x10001:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        state->cursor = state->cursor + 1;
      }
      else {
        ImGuiStb::stb_textedit_move_to_last(this,state);
      }
      ImGuiStb::stb_textedit_clamp(this,state);
      goto LAB_001957b4;
    case 0x10002:
switchD_00194eb2_caseD_10002:
      local_74 = (this->StbState).single_line;
      if (local_74 == '\0') {
        iVar15 = (this->StbState).select_start;
        iVar18 = (this->StbState).select_end;
        if ((key & 0x20000U) == 0) {
          if (iVar15 != iVar18) {
            if (iVar18 < iVar15) {
              (this->StbState).select_end = iVar15;
              (this->StbState).select_start = iVar18;
            }
            iVar15 = (this->StbState).select_start;
            (this->StbState).cursor = iVar15;
            (this->StbState).select_end = iVar15;
            (this->StbState).has_preferred_x = '\0';
          }
        }
        else if (iVar15 == iVar18) {
          iVar15 = (this->StbState).cursor;
          (this->StbState).select_end = iVar15;
          (this->StbState).select_start = iVar15;
        }
        else {
          state->cursor = iVar18;
        }
        ImGuiStb::stb_textedit_clamp(this,state);
        ImGuiStb::stb_textedit_find_charpos
                  ((ImGuiStb *)local_48,(StbFindState *)this,
                   (ImGuiTextEditState *)(ulong)(uint)(this->StbState).cursor,
                   (uint)(this->StbState).single_line,(int)in_R8);
        iVar15 = local_34;
        if (local_34 != local_3c) {
          pIVar16 = (ImGuiStb *)pfVar1;
          if ((this->StbState).has_preferred_x == '\0') {
            pIVar16 = (ImGuiStb *)local_48;
          }
          fVar4 = *(float *)pIVar16;
          (this->StbState).cursor = local_34;
          puVar10 = (this->Text).Data;
          local_50 = (ImWchar *)0x0;
          pIVar3 = puVar10 + local_34;
          InputTextCalcTextSizeW
                    (pIVar3,puVar10 + this->CurLenW,&local_50,(ImVec2 *)0x1,SUB81(in_R8,0));
          iVar18 = (int)((ulong)((long)local_50 - (long)pIVar3) >> 1);
          if (0 < iVar18) {
            fVar24 = 0.0;
            iVar14 = 1;
            do {
              fVar23 = ImGuiStb::STB_TEXTEDIT_GETWIDTH(this,iVar15,iVar14 + -1);
              if (((fVar23 == -1.0) && (!NAN(fVar23))) || (fVar24 = fVar24 + fVar23, fVar4 < fVar24)
                 ) {
                bVar12 = false;
              }
              else {
                state->cursor = state->cursor + 1;
                bVar12 = true;
              }
            } while ((bVar12) && (bVar12 = iVar14 < iVar18, iVar14 = iVar14 + 1, bVar12));
          }
LAB_00195161:
          ImGuiStb::stb_textedit_clamp(this,state);
          (this->StbState).has_preferred_x = '\x01';
          (this->StbState).preferred_x = fVar4;
          if ((key & 0x20000U) != 0) {
            (this->StbState).select_end = (this->StbState).cursor;
          }
        }
LAB_001951a0:
        local_74 = '\0';
      }
      else {
        key = key & 0x20000U | 0x10000;
      }
      break;
    case 0x10003:
switchD_00194eb2_caseD_10003:
      local_74 = (this->StbState).single_line;
      if (local_74 == '\0') {
        iVar15 = (this->StbState).select_start;
        iVar18 = (this->StbState).select_end;
        if ((key & 0x20000U) == 0) {
          if (iVar15 != iVar18) {
            ImGuiStb::stb_textedit_move_to_last(this,state);
          }
        }
        else if (iVar15 == iVar18) {
          iVar15 = (this->StbState).cursor;
          (this->StbState).select_end = iVar15;
          (this->StbState).select_start = iVar15;
        }
        else {
          state->cursor = iVar18;
        }
        ImGuiStb::stb_textedit_clamp(this,state);
        ImGuiStb::stb_textedit_find_charpos
                  ((ImGuiStb *)local_48,(StbFindState *)this,
                   (ImGuiTextEditState *)(ulong)(uint)(this->StbState).cursor,
                   (uint)(this->StbState).single_line,(int)in_R8);
        if ((long)local_38 != 0) {
          pIVar16 = (ImGuiStb *)pfVar1;
          if ((this->StbState).has_preferred_x == '\0') {
            pIVar16 = (ImGuiStb *)local_48;
          }
          fVar4 = *(float *)pIVar16;
          lVar19 = (long)local_3c + (long)local_38;
          iVar15 = (int)lVar19;
          (this->StbState).cursor = iVar15;
          puVar10 = (this->Text).Data;
          local_50 = (ImWchar *)0x0;
          pIVar3 = puVar10 + lVar19;
          InputTextCalcTextSizeW
                    (pIVar3,puVar10 + this->CurLenW,&local_50,(ImVec2 *)0x1,SUB81(in_R8,0));
          iVar18 = (int)((ulong)((long)local_50 - (long)pIVar3) >> 1);
          if (0 < iVar18) {
            fVar24 = 0.0;
            iVar14 = 1;
            do {
              fVar23 = ImGuiStb::STB_TEXTEDIT_GETWIDTH(this,iVar15,iVar14 + -1);
              if (((fVar23 == -1.0) && (!NAN(fVar23))) || (fVar24 = fVar24 + fVar23, fVar4 < fVar24)
                 ) {
                bVar12 = false;
              }
              else {
                state->cursor = state->cursor + 1;
                bVar12 = true;
              }
            } while ((bVar12) && (bVar12 = iVar14 < iVar18, iVar14 = iVar14 + 1, bVar12));
          }
          goto LAB_00195161;
        }
        goto LAB_001951a0;
      }
      key = key & 0x20000U | 0x10001;
      break;
    case 0x10004:
      ImGuiStb::stb_textedit_clamp(this,state);
      iVar15 = (this->StbState).select_start;
      iVar18 = (this->StbState).select_end;
      if (iVar15 != iVar18) {
        if (iVar18 < iVar15) {
          (this->StbState).select_end = iVar15;
          (this->StbState).select_start = iVar18;
        }
        iVar15 = (this->StbState).select_start;
        (this->StbState).cursor = iVar15;
        (this->StbState).select_end = iVar15;
        (this->StbState).has_preferred_x = '\0';
      }
      if ((this->StbState).single_line != '\0') {
        state->cursor = 0;
        goto LAB_001957b4;
      }
      iVar15 = state->cursor;
      if ((long)iVar15 < 1) goto LAB_001957b4;
      if ((this->Text).Size < iVar15) goto LAB_00195b25;
      puVar10 = (this->Text).Data;
      lVar19 = (long)iVar15;
      goto LAB_001957ee;
    case 0x10005:
      iVar15 = this->CurLenW;
      ImGuiStb::stb_textedit_clamp(this,state);
      iVar18 = (this->StbState).select_start;
      iVar14 = (this->StbState).select_end;
      if (iVar18 != iVar14) {
        if (iVar14 < iVar18) {
          (this->StbState).select_end = iVar18;
          (this->StbState).select_start = iVar14;
        }
        iVar18 = (this->StbState).select_start;
        (this->StbState).cursor = iVar18;
        (this->StbState).select_end = iVar18;
        (this->StbState).has_preferred_x = '\0';
      }
      if ((this->StbState).single_line != '\0') {
        state->cursor = iVar15;
        goto LAB_001957b4;
      }
      iVar18 = state->cursor;
      if (iVar15 <= iVar18) goto LAB_001957b4;
      iVar14 = (this->Text).Size;
      if (iVar14 <= iVar18) {
        iVar14 = iVar18;
      }
      puVar10 = (this->Text).Data;
      lVar19 = 0;
      goto LAB_00195835;
    case 0x10006:
      (this->StbState).select_end = 0;
      (this->StbState).cursor = 0;
      (this->StbState).select_start = 0;
      goto LAB_001957b4;
    case 0x10007:
      (this->StbState).cursor = this->CurLenW;
      (this->StbState).select_start = 0;
      (this->StbState).select_end = 0;
      goto LAB_001957b4;
    case 0x10008:
switchD_00194eb2_caseD_10008:
      if ((this->StbState).select_start != (this->StbState).select_end) goto LAB_00195219;
      iVar15 = (this->StbState).cursor;
      if (iVar15 < this->CurLenW) {
        ImGuiStb::stb_textedit_delete(this,state,iVar15,1);
      }
      goto LAB_001957b4;
    case 0x10009:
switchD_00194eb2_caseD_10009:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        ImGuiStb::stb_textedit_clamp(this,state);
        iVar15 = (this->StbState).cursor;
        if (0 < iVar15) {
          ImGuiStb::stb_textedit_delete(this,state,iVar15 + -1,1);
          (this->StbState).cursor = (this->StbState).cursor + -1;
        }
      }
      else {
LAB_00195219:
        ImGuiStb::stb_textedit_delete_selection(this,state);
      }
      goto LAB_001957b4;
    case 0x1000a:
      lVar19 = (long)(this->StbState).undostate.undo_point;
      if (lVar19 == 0) goto LAB_001957b4;
      iVar15 = (this->StbState).undostate.undo_rec[lVar19 + -1].where;
      sVar5 = (this->StbState).undostate.undo_rec[lVar19 + -1].insert_length;
      sVar6 = (this->StbState).undostate.undo_rec[lVar19 + -1].delete_length;
      uVar22 = (uint)sVar6;
      sVar7 = (this->StbState).undostate.undo_rec[lVar19 + -1].char_storage;
      lVar19 = (long)(this->StbState).undostate.redo_point;
      (this->StbState).undostate.undo_rec[lVar19 + -1].char_storage = -1;
      (this->StbState).undostate.undo_rec[lVar19 + -1].insert_length = sVar6;
      (this->StbState).undostate.undo_rec[lVar19 + -1].delete_length = sVar5;
      (this->StbState).undostate.undo_rec[lVar19 + -1].where = iVar15;
      if (sVar6 == 0) goto LAB_00195ae4;
      if ((int)((int)(this->StbState).undostate.undo_char_point + uVar22) < 999) goto LAB_001958bf;
      (this->StbState).undostate.undo_rec[lVar19 + -1].insert_length = 0;
      goto LAB_00195ad1;
    case 0x1000b:
      lVar19 = (long)(this->StbState).undostate.redo_point;
      if (lVar19 == 99) goto LAB_001957b4;
      sVar5 = (this->StbState).undostate.undo_point;
      iVar15 = (this->StbState).undostate.undo_rec[lVar19].where;
      sVar6 = (this->StbState).undostate.undo_rec[lVar19].insert_length;
      sVar7 = (this->StbState).undostate.undo_rec[lVar19].delete_length;
      sVar8 = (this->StbState).undostate.undo_rec[lVar19].char_storage;
      (this->StbState).undostate.undo_rec[sVar5].delete_length = sVar6;
      (this->StbState).undostate.undo_rec[sVar5].insert_length = sVar7;
      (this->StbState).undostate.undo_rec[sVar5].where = iVar15;
      (this->StbState).undostate.undo_rec[sVar5].char_storage = -1;
      if (sVar7 == 0) goto LAB_00195a17;
      sVar9 = (this->StbState).undostate.undo_char_point;
      if ((int)(this->StbState).undostate.redo_char_point < (int)sVar9 + (int)sVar7) {
        pSVar11 = (this->StbState).undostate.undo_rec + sVar5;
        pSVar11->insert_length = 0;
        pSVar11->delete_length = 0;
        goto LAB_00195a0c;
      }
      (this->StbState).undostate.undo_rec[sVar5].char_storage = sVar9;
      (this->StbState).undostate.undo_char_point = sVar9 + sVar7;
      if (sVar7 < 1) goto LAB_00195a0c;
      iVar18 = (this->Text).Size;
      if (iVar18 < iVar15) {
        iVar18 = iVar15;
      }
      puVar10 = (this->Text).Data;
      uVar21 = 0;
      goto LAB_001959e0;
    case 0x1000c:
      iVar15 = (this->StbState).select_start;
      iVar18 = (this->StbState).select_end;
      if (iVar15 == iVar18) {
        iVar15 = state->cursor;
        goto LAB_0019537f;
      }
      if (iVar18 < iVar15) {
        (this->StbState).select_end = iVar15;
        (this->StbState).select_start = iVar18;
      }
      iVar15 = (this->StbState).select_start;
      (this->StbState).cursor = iVar15;
      goto LAB_001957b1;
    case 0x1000d:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        iVar15 = this->CurLenW;
        iVar18 = (this->StbState).cursor;
        goto LAB_001953f0;
      }
      ImGuiStb::stb_textedit_move_to_last(this,state);
      goto LAB_001957b8;
    default:
      switch(key) {
      case 0x30000:
        ImGuiStb::stb_textedit_clamp(this,state);
        iVar15 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar15) {
          iVar15 = (this->StbState).cursor;
          (this->StbState).select_end = iVar15;
          (this->StbState).select_start = iVar15;
        }
        else {
          state->cursor = iVar15;
        }
        iVar15 = (this->StbState).select_end;
        if (0 < iVar15) {
          (this->StbState).select_end = iVar15 + -1;
        }
        break;
      case 0x30001:
        iVar15 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar15) {
          iVar15 = (this->StbState).cursor;
          (this->StbState).select_end = iVar15;
          (this->StbState).select_start = iVar15;
        }
        else {
          state->cursor = iVar15;
        }
        piVar2 = &(this->StbState).select_end;
        *piVar2 = *piVar2 + 1;
        ImGuiStb::stb_textedit_clamp(this,state);
        break;
      case 0x30002:
        goto switchD_00194eb2_caseD_10002;
      case 0x30003:
        goto switchD_00194eb2_caseD_10003;
      case 0x30004:
        ImGuiStb::stb_textedit_clamp(this,state);
        iVar15 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar15) {
          iVar15 = (this->StbState).cursor;
          (this->StbState).select_end = iVar15;
          (this->StbState).select_start = iVar15;
        }
        else {
          state->cursor = iVar15;
        }
        if ((this->StbState).single_line != '\0') {
          state->cursor = 0;
          goto LAB_001957ae;
        }
        iVar15 = state->cursor;
        if ((long)iVar15 < 1) goto LAB_001957ae;
        if ((this->Text).Size < iVar15) goto LAB_00195b25;
        puVar10 = (this->Text).Data;
        lVar19 = (long)iVar15;
        goto LAB_00195748;
      case 0x30005:
        iVar15 = this->CurLenW;
        ImGuiStb::stb_textedit_clamp(this,state);
        iVar18 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar18) {
          iVar18 = (this->StbState).cursor;
          (this->StbState).select_end = iVar18;
          (this->StbState).select_start = iVar18;
        }
        else {
          state->cursor = iVar18;
        }
        if ((this->StbState).single_line != '\0') {
          state->cursor = iVar15;
          goto LAB_001957ae;
        }
        iVar18 = state->cursor;
        if (iVar15 <= iVar18) goto LAB_001957ae;
        iVar14 = (this->Text).Size;
        if (iVar14 <= iVar18) {
          iVar14 = iVar18;
        }
        puVar10 = (this->Text).Data;
        lVar19 = 0;
        goto LAB_0019578f;
      case 0x30006:
        iVar15 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar15) {
          iVar15 = (this->StbState).cursor;
          (this->StbState).select_end = iVar15;
          (this->StbState).select_start = iVar15;
        }
        else {
          state->cursor = iVar15;
        }
        iVar15 = 0;
        goto LAB_001956b8;
      case 0x30007:
        iVar15 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar15) {
          iVar15 = (this->StbState).cursor;
          (this->StbState).select_end = iVar15;
          (this->StbState).select_start = iVar15;
        }
        else {
          state->cursor = iVar15;
        }
        iVar15 = this->CurLenW;
LAB_001956b8:
        (this->StbState).select_end = iVar15;
        goto LAB_001956bb;
      case 0x30008:
        goto switchD_00194eb2_caseD_10008;
      case 0x30009:
        goto switchD_00194eb2_caseD_10009;
      default:
        uVar22 = 0;
        if (key < 0x10000) {
          uVar22 = key;
        }
        if (((int)uVar22 < 1) ||
           ((local_48[0] = (ImWchar)uVar22, uVar22 == 10 && ((this->StbState).single_line != '\0')))
           ) goto LAB_001957b8;
        if (((this->StbState).insert_mode == '\0') ||
           (((this->StbState).select_start != (this->StbState).select_end ||
            (iVar15 = (this->StbState).cursor, this->CurLenW <= iVar15)))) {
          ImGuiStb::stb_textedit_delete_selection(this,state);
          bVar12 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,local_48,1);
          if (!bVar12) goto LAB_001957b8;
          ImGuiStb::stb_text_createundo(&(this->StbState).undostate,(this->StbState).cursor,0,1);
        }
        else {
          ImGuiStb::stb_text_makeundo_replace(this,state,iVar15,0x1de750,(int)in_R8);
          ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,(this->StbState).cursor,1);
          bVar12 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,local_48,1);
          if (!bVar12) goto LAB_001957b8;
        }
        (this->StbState).cursor = (this->StbState).cursor + 1;
        goto LAB_001957b4;
      case 0x3000c:
        if ((this->StbState).select_start == (this->StbState).select_end) {
          iVar15 = (this->StbState).cursor;
          (this->StbState).select_end = iVar15;
          (this->StbState).select_start = iVar15;
        }
        iVar15 = state->cursor;
        goto LAB_001952bc;
      case 0x3000d:
        if ((this->StbState).select_start == (this->StbState).select_end) {
          iVar15 = (this->StbState).cursor;
          (this->StbState).select_end = iVar15;
          (this->StbState).select_start = iVar15;
        }
        iVar15 = this->CurLenW;
        iVar18 = (this->StbState).cursor;
        goto LAB_00195318;
      }
      iVar15 = (this->StbState).select_end;
LAB_001956bb:
      (this->StbState).cursor = iVar15;
      goto LAB_001957b4;
    }
  } while (local_74 != '\0');
  goto LAB_001957b8;
  while (iVar14 = ImGuiStb::is_word_boundary_from_right(this,iVar18), iVar14 == 0) {
LAB_00195318:
    iVar18 = iVar18 + 1;
    if (iVar15 <= iVar18) break;
  }
  if (iVar18 < iVar15) {
    iVar15 = iVar18;
  }
  (this->StbState).cursor = iVar15;
  (this->StbState).select_end = iVar15;
  goto LAB_00195414;
  while (iVar14 = ImGuiStb::is_word_boundary_from_right(this,iVar18), iVar15 = iVar18, iVar14 == 0)
  {
LAB_001952bc:
    iVar18 = iVar15 + -1;
    if (iVar15 < 1) break;
  }
  iVar15 = 0;
  if (0 < iVar18) {
    iVar15 = iVar18;
  }
  (this->StbState).cursor = iVar15;
  (this->StbState).select_end = iVar15;
  goto LAB_00195414;
  while( true ) {
    state->cursor = iVar18 + 1 + (int)lVar19;
    lVar19 = lVar19 + 1;
    if (iVar15 - iVar18 == (int)lVar19) break;
LAB_0019578f:
    if ((long)iVar14 - (long)iVar18 == lVar19) goto LAB_00195b25;
    if (puVar10[iVar18 + lVar19] == 10) break;
  }
  goto LAB_001957ae;
  while( true ) {
    state->cursor = (int)lVar19 + -1;
    bVar12 = lVar19 < 2;
    lVar19 = lVar19 + -1;
    if (bVar12) break;
LAB_00195748:
    if (puVar10[lVar19 + -1] == 10) break;
  }
LAB_001957ae:
  iVar15 = (this->StbState).cursor;
LAB_001957b1:
  (this->StbState).select_end = iVar15;
  goto LAB_001957b4;
  while (iVar14 = ImGuiStb::is_word_boundary_from_right(this,iVar18), iVar14 == 0) {
LAB_001953f0:
    iVar18 = iVar18 + 1;
    if (iVar15 <= iVar18) break;
  }
  if (iVar18 < iVar15) {
    iVar15 = iVar18;
  }
  (this->StbState).cursor = iVar15;
  goto LAB_00195414;
  while (iVar14 = ImGuiStb::is_word_boundary_from_right(this,iVar18), iVar15 = iVar18, iVar14 == 0)
  {
LAB_0019537f:
    iVar18 = iVar15 + -1;
    if (iVar15 < 1) break;
  }
  iVar15 = 0;
  if (0 < iVar18) {
    iVar15 = iVar18;
  }
  (this->StbState).cursor = iVar15;
LAB_00195414:
  ImGuiStb::stb_textedit_clamp(this,state);
  goto LAB_001957b8;
  while( true ) {
    (this->StbState).undostate.undo_char
    [(long)(this->StbState).undostate.undo_rec[sVar5].char_storage + uVar21] =
         puVar10[(long)iVar15 + uVar21];
    uVar21 = uVar21 + 1;
    if ((long)(this->StbState).undostate.undo_rec[sVar5].insert_length <= (long)uVar21) break;
LAB_001959e0:
    if ((uint)(iVar18 - iVar15) == uVar21) goto LAB_00195b25;
  }
LAB_00195a0c:
  ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar15,(int)sVar7);
LAB_00195a17:
  if (sVar6 != 0) {
    ImGuiStb::STB_TEXTEDIT_INSERTCHARS
              (this,iVar15,(this->StbState).undostate.undo_char + sVar8,(int)sVar6);
    psVar20 = &(this->StbState).undostate.redo_char_point;
    *psVar20 = *psVar20 + sVar6;
  }
  (this->StbState).cursor = iVar15 + sVar6;
  psVar20 = &(this->StbState).undostate.undo_point;
  *psVar20 = *psVar20 + 1;
  psVar20 = &(this->StbState).undostate.redo_point;
  *psVar20 = *psVar20 + 1;
  goto LAB_001957b4;
  while( true ) {
    if (sVar9 < 99) {
      if (-1 < (this->StbState).undostate.undo_rec[0x62].char_storage) {
        sVar9 = (this->StbState).undostate.undo_rec[0x62].insert_length;
        sVar13 = sVar8 + sVar9;
        (this->StbState).undostate.redo_char_point = sVar13;
        pIVar3 = (this->StbState).undostate.undo_char + sVar13;
        memmove(pIVar3,pIVar3 + -(long)sVar9,(long)sVar13 * -2 + 0x7ce);
        lVar19 = (long)(this->StbState).undostate.redo_point;
        if (lVar19 < 0x62) {
          lVar17 = lVar19 + -0x62;
          psVar20 = &(this->StbState).undostate.undo_rec[lVar19].char_storage;
          do {
            if (-1 < *psVar20) {
              *psVar20 = *psVar20 + sVar9;
            }
            psVar20 = psVar20 + 6;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0);
        }
      }
      lVar19 = (long)(this->StbState).undostate.redo_point;
      memmove((this->StbState).undostate.undo_rec + lVar19,
              (this->StbState).undostate.undo_rec + lVar19 + -1,(99 - lVar19) * 0xc);
      psVar20 = &(this->StbState).undostate.redo_point;
      *psVar20 = *psVar20 + 1;
    }
    if ((this->StbState).undostate.redo_point == 99) break;
LAB_001958bf:
    iVar18 = (int)(this->StbState).undostate.undo_char_point + uVar22;
    sVar8 = (this->StbState).undostate.redo_char_point;
    sVar9 = (this->StbState).undostate.redo_point;
    if (iVar18 <= sVar8) {
      (this->StbState).undostate.undo_rec[(long)sVar9 + -1].char_storage = sVar8 - sVar6;
      (this->StbState).undostate.redo_char_point = sVar8 - sVar6;
      if (0 < sVar6) {
        iVar14 = (this->Text).Size;
        if (iVar14 < iVar15) {
          iVar14 = iVar15;
        }
        puVar10 = (this->Text).Data;
        uVar21 = 0;
        goto LAB_00195a9c;
      }
      break;
    }
  }
  goto LAB_00195abe;
  while( true ) {
    (this->StbState).undostate.undo_char
    [(long)(this->StbState).undostate.undo_rec[(long)sVar9 + -1].char_storage + uVar21] =
         puVar10[(long)iVar15 + uVar21];
    uVar21 = uVar21 + 1;
    if (uVar22 == uVar21) break;
LAB_00195a9c:
    if ((uint)(iVar14 - iVar15) == uVar21) goto LAB_00195b25;
  }
LAB_00195abe:
  if (iVar18 <= sVar8) {
LAB_00195ad1:
    ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar15,uVar22);
LAB_00195ae4:
    if (sVar5 != 0) {
      ImGuiStb::STB_TEXTEDIT_INSERTCHARS
                (this,iVar15,(this->StbState).undostate.undo_char + sVar7,(int)sVar5);
      psVar20 = &(this->StbState).undostate.undo_char_point;
      *psVar20 = *psVar20 - sVar5;
    }
    (this->StbState).cursor = iVar15 + sVar5;
    psVar20 = &(this->StbState).undostate.undo_point;
    *psVar20 = *psVar20 + -1;
    psVar20 = &(this->StbState).undostate.redo_point;
    *psVar20 = *psVar20 + -1;
  }
  goto LAB_001957b4;
  while( true ) {
    state->cursor = iVar18 + 1 + (int)lVar19;
    lVar19 = lVar19 + 1;
    if (iVar15 - iVar18 == (int)lVar19) break;
LAB_00195835:
    if ((long)iVar14 - (long)iVar18 == lVar19) {
LAB_00195b25:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4c1,
                    "const value_type &ImVector<unsigned short>::operator[](int) const [T = unsigned short]"
                   );
    }
    if (puVar10[iVar18 + lVar19] == 10) break;
  }
  goto LAB_001957b4;
  while( true ) {
    state->cursor = (int)lVar19 + -1;
    bVar12 = lVar19 < 2;
    lVar19 = lVar19 + -1;
    if (bVar12) break;
LAB_001957ee:
    if (puVar10[lVar19 + -1] == 10) break;
  }
LAB_001957b4:
  (this->StbState).has_preferred_x = '\0';
LAB_001957b8:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiTextEditState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &StbState, key);
    CursorFollow = true;
    CursorAnimReset();
}